

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

string * __thiscall
AlsaBackendFactory::probe_abi_cxx11_
          (string *__return_storage_ptr__,AlsaBackendFactory *this,BackendType type)

{
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> *this_00
  ;
  vector<DevMap> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (type == Capture) {
    anon_unknown.dwarf_239414::probe_devices(&local_30,SND_PCM_STREAM_CAPTURE);
    this_00 = (vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               *)&(anonymous_namespace)::CaptureDevices;
  }
  else {
    if (type != Playback) {
      return __return_storage_ptr__;
    }
    anon_unknown.dwarf_239414::probe_devices(&local_30,SND_PCM_STREAM_PLAYBACK);
    this_00 = (vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               *)&(anonymous_namespace)::PlaybackDevices;
  }
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  operator=(this_00,&local_30);
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  ~vector(&local_30);
  std::
  for_each<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,AlsaBackendFactory::probe[abi:cxx11](BackendType)::__0>
            ((this_00->
             super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (this_00->
             super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (anon_class_8_1_ebf5ae38)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string AlsaBackendFactory::probe(BackendType type)
{
    std::string outnames;

    auto add_device = [&outnames](const DevMap &entry) -> void
    {
        /* +1 to also append the null char (to ensure a null-separated list and
         * double-null terminated list).
         */
        outnames.append(entry.name.c_str(), entry.name.length()+1);
    };
    switch(type)
    {
    case BackendType::Playback:
        PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);
        std::for_each(PlaybackDevices.cbegin(), PlaybackDevices.cend(), add_device);
        break;

    case BackendType::Capture:
        CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);
        std::for_each(CaptureDevices.cbegin(), CaptureDevices.cend(), add_device);
        break;
    }

    return outnames;
}